

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O2

fy_parser_state fy_parse_state_pop(fy_parser *fyp)

{
  fy_parse_state_log *_n;
  list_head *plVar1;
  list_head *plVar2;
  fy_parser_state fVar3;
  
  _n = (fy_parse_state_log *)(fyp->state_stack)._lh.next;
  fVar3 = FYPS_NONE;
  if (_n != (fy_parse_state_log *)0x0 && _n != (fy_parse_state_log *)&fyp->state_stack) {
    plVar1 = (_n->node).next;
    plVar2 = (_n->node).prev;
    plVar1->prev = plVar2;
    plVar2->next = plVar1;
    (_n->node).next = (list_head *)_n;
    (_n->node).prev = (list_head *)_n;
    fVar3 = _n->state;
    fy_parse_parse_state_log_recycle(fyp,_n);
  }
  return fVar3;
}

Assistant:

enum fy_parser_state fy_parse_state_pop(struct fy_parser *fyp) {
    struct fy_parse_state_log *fypsl;
    enum fy_parser_state state;

    fypsl = fy_parse_state_log_list_pop(&fyp->state_stack);
    if (!fypsl)
        return FYPS_NONE;

    state = fypsl->state;

    fy_parse_parse_state_log_recycle(fyp, fypsl);

    return state;
}